

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O3

_Bool str_to_usize(char *string,size_t *out)

{
  char cVar1;
  size_t sVar2;
  int *piVar3;
  uintmax_t uVar4;
  uintmax_t uVar5;
  int __base;
  bool bVar6;
  _Bool _Var7;
  char *endptr;
  char *local_38;
  
  sVar2 = strlen(string);
  __base = 10;
  if (sVar2 == 0) {
    bVar6 = false;
    sVar2 = 0;
  }
  else {
    cVar1 = *string;
    if ((cVar1 == '-') || (cVar1 == '+')) {
      bVar6 = cVar1 == '-';
      sVar2 = sVar2 - 1;
      string = string + 1;
    }
    else {
      bVar6 = false;
    }
    if (1 < sVar2) {
      if (*string == '0') {
        if (string[1] == 'b') {
          string = string + 2;
          sVar2 = sVar2 - 2;
          __base = 2;
          goto LAB_00104afa;
        }
        if (string[1] == 'x') {
          string = string + 2;
          sVar2 = sVar2 - 2;
          __base = 0x10;
          goto LAB_00104afa;
        }
      }
      sVar2 = 1;
    }
  }
LAB_00104afa:
  local_38 = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  uVar4 = strtoumax(string,&local_38,__base);
  uVar5 = 0;
  _Var7 = false;
  if (((sVar2 != 0) && (!bVar6)) && (*piVar3 != 0x22)) {
    if (local_38 == (char *)0x0 || local_38 == string) {
      _Var7 = false;
      uVar5 = 0;
    }
    else {
      _Var7 = *local_38 == '\0';
      uVar5 = 0;
      if (_Var7) {
        uVar5 = uVar4;
      }
    }
  }
  *out = uVar5;
  return _Var7;
}

Assistant:

bool str_to_usize(const char *string, size_t *out) {
    size_t len = strlen(string);
    int base = 10;

    bool is_negated = false;
    if (len >= 1 && (string[0] == '-' || string[0] == '+')) {
        is_negated = string[0] == '-';

        len -= 1;
        string += 1;
    }

    if (len >= 2 && string[0] == '0' && string[1] == 'x') {
        base = 16;
        string += 2;
        len -= 2;
    } else if (len >= 2 && string[0] == '0' && string[1] == 'b') {
        base = 2;
        string += 2;
        len -= 2;
    }

    STATIC_ASSERT(sizeof(uintmax_t) >= sizeof(size_t),
                  "These sizes should match so that we can use the correct "
                  "strtoXXX C function");

    char *endptr = NULL;
    errno = 0;
    uintmax_t conv_ret_val = strtoumax(string, &endptr, base);

    bool out_of_range =
        (errno == ERANGE) || (conv_ret_val > UINTMAX_MAX) || is_negated;

    bool failed =
        len == 0 || out_of_range || endptr == string || endptr == NULL;
    bool result = !failed && *endptr == '\0';

    if (result) {
        *out = conv_ret_val;
    } else {
        *out = 0;
    }

    return result;
}